

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_leading_minus_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  bool bVar1;
  error_category *peVar2;
  error_code err;
  
  if (c == '-') {
    (this->super_matcher<pstore::json::null_output>).state_ = 3;
    (this->super_matcher<pstore::json::null_output>).field_0xc = 1;
  }
  else {
    if ((byte)(c - 0x30U) < 10) {
      (this->super_matcher<pstore::json::null_output>).state_ = 3;
      bVar1 = do_integer_initial_digit_state(this,parser,c);
      return bVar1;
    }
    peVar2 = get_error_category();
    err._M_cat = peVar2;
    err._0_8_ = 6;
    bVar1 = parser<pstore::json::null_output>::set_error(parser,err);
    if (bVar1) {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
    }
  }
  return true;
}

Assistant:

bool number_matcher<Callbacks>::do_leading_minus_state (parser<Callbacks> & parser,
                                                                    char c) {
                bool match = true;
                if (c == '-') {
                    this->set_state (integer_initial_digit_state);
                    is_neg_ = true;
                } else if (c >= '0' && c <= '9') {
                    this->set_state (integer_initial_digit_state);
                    match = do_integer_initial_digit_state (parser, c);
                } else {
                    // minus MUST be followed by the 'int' production.
                    this->set_error (parser, error_code::number_out_of_range);
                }
                return match;
            }